

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O3

void __thiscall
Qentem::QTest::PrintErrorMessage<Qentem::StringStream<wchar_t>,wchar_t[91]>
          (QTest *this,bool equal,StringStream<wchar_t> *value1,wchar_t (*value2) [91],
          unsigned_long line)

{
  size_t sVar1;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar2;
  undefined7 in_register_00000031;
  wostream *pwVar3;
  char *pcVar4;
  char local_41;
  char *local_40;
  char *local_38;
  
  local_38 = TestOutPut::GetColor(ERROR);
  local_40 = TestOutPut::GetColor(END);
  local_41 = '\n';
  TestOutPut::Print<char_const*,char[7],char_const*,char[3],char_const*,char>
            (&local_38,(char (*) [7])"Failed",&local_40,(char (*) [3])0x13029a,&this->part_name_,
             &local_41);
  pcVar4 = " ";
  if ((int)CONCAT71(in_register_00000031,equal) != 0) {
    pcVar4 = " not ";
  }
  if (TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ == 0) {
    pwVar3 = (wostream *)&std::wcout;
  }
  else {
    pwVar3 = (wostream *)(TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ + 0x10);
  }
  pwVar3 = std::operator<<(pwVar3,this->file_fullname_);
  pwVar3 = std::operator<<(pwVar3,":");
  pwVar3 = std::wostream::_M_insert<unsigned_long>((ulong)pwVar3);
  pwVar3 = std::operator<<(pwVar3,":\n Should");
  pwVar3 = std::operator<<(pwVar3,pcVar4);
  pwVar3 = std::operator<<(pwVar3,"equal: `");
  sVar1 = wcslen(*value2);
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar3,*value2,sVar1);
  pwVar3 = std::operator<<(pwVar3,"`\n     Returned: `");
  pbVar2 = operator<<((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)pwVar3,value1);
  std::operator<<((wostream *)pbVar2,"`\n\n");
  return;
}

Assistant:

QENTEM_NOINLINE void PrintErrorMessage(bool equal, const Value1_T &value1, const Value2_T &value2,
                                           unsigned long line) {
        TestOutPut::Print(TestOutPut::GetColor(TestOutPut::Colors::ERROR), "Failed",
                          TestOutPut::GetColor(TestOutPut::Colors::END), ": ", part_name_, '\n');
        TestOutPut::Print(file_fullname_, ":", line, ":\n Should", (equal ? " not " : " "), "equal: `", value2,
                          "`\n     Returned: `", value1, "`\n\n");
    }